

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles2::Functional::eval_selection_bvec4(ShaderEvalContext *c)

{
  float fVar1;
  tcu *v;
  tcu local_74 [4];
  tcu local_70 [4];
  Vector<bool,_4> local_6c;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  fVar1 = c->in[0].m_data[2];
  local_38.m_data[3] = c->in[1].m_data[0];
  local_38.m_data[2] = c->in[1].m_data[1];
  local_38.m_data[1] = c->in[1].m_data[2];
  local_38.m_data[0] = c->in[1].m_data[3];
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 0.0;
  tcu::greaterThan<float,4>(local_70,&local_38,&local_48);
  local_58.m_data[0] = c->in[2].m_data[0];
  local_58.m_data[3] = c->in[2].m_data[1];
  local_58.m_data[2] = c->in[2].m_data[2];
  local_58.m_data[1] = c->in[2].m_data[3];
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[3] = 0.0;
  tcu::greaterThan<float,4>(local_74,&local_58,&local_68);
  v = local_74;
  if (0.0 < fVar1) {
    v = local_70;
  }
  tcu::Vector<bool,_4>::Vector(&local_6c,(Vector<bool,_4> *)v);
  tcu::Vector<bool,_4>::cast<float>((Vector<bool,_4> *)&local_28);
  *(undefined8 *)(c->color).m_data = local_28;
  *(undefined8 *)((c->color).m_data + 2) = uStack_20;
  return;
}

Assistant:

void eval_selection_bvec4	(ShaderEvalContext& c) { c.color		= selection(c.in[0].z() > 0.0f,			greaterThan(c.in[1].swizzle(3, 2, 1, 0), Vec4(0.0f, 0.0f, 0.0f, 0.0f)),	greaterThan(c.in[2].swizzle(0, 3, 2, 1), Vec4(0.0f, 0.0f, 0.0f, 0.0f))).asFloat(); }